

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall irr::gui::CGUITabControl::~CGUITabControl(CGUITabControl *this,void **vtt)

{
  u32 uVar1;
  IGUITab **ppIVar2;
  long *in_RSI;
  long *in_RDI;
  u32 i;
  undefined4 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  uint local_14;
  
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = in_RSI[5];
  local_14 = 0;
  while( true ) {
    uVar3 = local_14;
    uVar1 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3cf408);
    if (uVar1 <= uVar3) break;
    ppIVar2 = core::array<irr::gui::IGUITab_*>::operator[]
                        ((array<irr::gui::IGUITab_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
    if (*ppIVar2 != (IGUITab *)0x0) {
      core::array<irr::gui::IGUITab_*>::operator[]
                ((array<irr::gui::IGUITab_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
      ;
    }
    local_14 = local_14 + 1;
  }
  if (in_RDI[0x2d] != 0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (in_RDI[0x2e] != 0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  core::array<irr::gui::IGUITab_*>::~array((array<irr::gui::IGUITab_*> *)0x3cf4bf);
  IGUITabControl::~IGUITabControl
            ((IGUITabControl *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
             (void **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

CGUITabControl::~CGUITabControl()
{
	for (u32 i = 0; i < Tabs.size(); ++i) {
		if (Tabs[i])
			Tabs[i]->drop();
	}

	if (UpButton)
		UpButton->drop();

	if (DownButton)
		DownButton->drop();
}